

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_conn.cc
# Opt level: O0

void __thiscall iqxmlrpc::Client_connection::Client_connection(Client_connection *this)

{
  allocator_type local_12;
  value_type_conflict local_11;
  Client_connection *local_10;
  Client_connection *this_local;
  
  this->_vptr_Client_connection = (_func_int **)&PTR__Client_connection_00251a68;
  local_10 = this;
  http::Packet_reader::Packet_reader(&this->preader);
  local_11 = '\0';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&this->read_buf_,0x10000,&local_11,&local_12);
  std::allocator<char>::~allocator(&local_12);
  return;
}

Assistant:

Client_connection::Client_connection():
  read_buf_(65536, '\0')
{
}